

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_flags nk_do_edit(nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_flags flags,
                   nk_plugin_filter filter,nk_text_edit *edit,nk_style_edit *style,nk_input *in,
                   nk_user_font *font)

{
  uchar uVar1;
  nk_color background;
  nk_color nVar2;
  nk_color nVar3;
  nk_plugin_copy p_Var4;
  nk_plugin_paste p_Var5;
  nk_vec2 nVar6;
  undefined1 auVar7 [16];
  nk_rect r;
  nk_input *i;
  undefined1 auVar8 [16];
  uchar uVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  char *pcVar16;
  nk_color *pnVar17;
  long lVar18;
  ulong uVar19;
  nk_style_edit *pnVar20;
  nk_color *pnVar21;
  void *pvVar22;
  nk_size nVar23;
  nk_style_edit *pnVar24;
  nk_color *pnVar25;
  nk_color nVar26;
  nk_color *pnVar27;
  nk_style_edit *pnVar28;
  nk_color *pnVar29;
  int iVar30;
  uint uVar31;
  nk_keys key;
  bool bVar32;
  float fVar33;
  ulong uVar34;
  float in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  float in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  float fVar35;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar36;
  float fVar37;
  float fVar38;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect r_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect scroll;
  nk_rect rect_03;
  nk_rect rect_04;
  nk_rect b;
  int in_stack_fffffffffffffdf8;
  nk_color nVar39;
  int in_stack_fffffffffffffe00;
  undefined8 local_1f8;
  nk_style_edit *local_1e0;
  char *local_1b0;
  char *local_1a8;
  nk_rune unicode_1;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  nk_size local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  nk_flags local_158;
  int local_154;
  int local_150;
  int glyph_offset;
  undefined1 local_148 [16];
  nk_input *local_138;
  ulong local_130;
  uint *local_128;
  nk_rune unicode;
  undefined1 local_118 [24];
  char *local_100;
  ulong local_f8;
  float local_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  nk_style_edit *local_d8;
  nk_style_edit *local_d0;
  int glyph_len;
  float fStack_c4;
  nk_color local_c0;
  nk_color local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  nk_rect clip;
  undefined8 local_88;
  undefined8 local_78;
  nk_rect old_clip;
  undefined4 extraout_XMM0_Db;
  
  auVar7._8_4_ = in_XMM1_Dc;
  auVar7._0_8_ = bounds._8_8_;
  auVar7._12_4_ = in_XMM1_Dd;
  local_168 = filter;
  local_118._0_16_ = auVar7;
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5966,
                  "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5967,
                  "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (style == (nk_style_edit *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5968,
                  "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                 );
  }
  fVar38 = style->border;
  fVar37 = (style->padding).x;
  fVar36 = (style->padding).y;
  local_148._8_4_ = in_XMM0_Dc;
  local_148._0_8_ = bounds._0_8_;
  local_148._12_4_ = in_XMM0_Dd;
  local_198 = fVar38 + fVar37 + bounds.x;
  fStack_194 = fVar38 + fVar36 + bounds.y;
  fStack_190 = fVar38 + in_XMM0_Dc + 0.0;
  fStack_18c = fVar38 + in_XMM0_Dd + 0.0;
  fVar38 = fVar38 + fVar38;
  local_118._0_4_ = bounds.w;
  local_118._4_4_ = bounds.h;
  local_e8 = (float)local_118._0_4_ - (fVar37 + fVar37 + fVar38);
  fVar37 = (float)local_118._4_4_ - (fVar36 + fVar36 + fVar38);
  fStack_e0 = in_XMM1_Dc - (fVar38 + 0.0);
  fStack_dc = in_XMM1_Dd - (fVar38 + 0.0);
  uVar11 = flags & 0x400;
  fVar38 = fVar37;
  if (uVar11 != 0) {
    local_e8 = local_e8 - (style->scrollbar_size).x;
    if (local_e8 <= 0.0) {
      local_e8 = 0.0;
    }
    fVar38 = font->height + style->row_padding;
  }
  old_clip.x = (out->clip).x;
  old_clip.y = (out->clip).y;
  old_clip.w = (out->clip).w;
  old_clip.h = (out->clip).h;
  local_128 = state;
  fStack_e4 = fVar37;
  local_a8 = fStack_194;
  fStack_a4 = fStack_194;
  fStack_a0 = fStack_194;
  fStack_9c = fStack_194;
  nk_unify(&clip,&old_clip,local_198,fStack_194,local_198 + local_e8,fStack_194 + fVar37);
  auVar8 = local_118._0_16_;
  auVar7 = local_148;
  uVar1 = edit->active;
  rect.w = (float)local_118._0_4_;
  rect.h = (float)local_118._4_4_;
  rect.x = (float)local_148._0_4_;
  rect.y = (float)local_148._4_4_;
  local_148 = auVar7;
  local_118._0_16_ = auVar8;
  iVar12 = nk_input_is_mouse_hovering_rect(in,rect);
  uVar9 = uVar1;
  if (((in != (nk_input *)0x0) && ((in->mouse).buttons[0].clicked != 0)) &&
     ((in->mouse).buttons[0].down != 0)) {
    fVar36 = (in->mouse).pos.x;
    uVar9 = false;
    if (((float)local_148._0_4_ <= fVar36) &&
       (fVar36 < (float)local_148._0_4_ + (float)local_118._0_4_)) {
      fVar36 = (in->mouse).pos.y;
      if ((float)local_148._4_4_ <= fVar36) {
        uVar9 = fVar36 < (float)local_148._4_4_ + (float)local_118._4_4_;
      }
      else {
        uVar9 = false;
      }
    }
    edit->active = uVar9;
  }
  fVar36 = (float)local_148._0_4_;
  fVar33 = (float)local_148._4_4_;
  if (uVar1 == '\0') {
    if (uVar9 == '\0') goto LAB_00121258;
    nk_textedit_clear_state(edit,uVar11 >> 10,local_168);
    bVar32 = (flags & 2) == 0;
    if ((flags >> 0xb & 1) != 0) {
      edit->cursor = (edit->string).len;
      in = (nk_input *)0x0;
    }
    fVar36 = (float)local_148._0_4_;
    fVar33 = (float)local_148._4_4_;
  }
  else {
    bVar32 = true;
    if (uVar9 == '\0') {
LAB_00121258:
      edit->mode = '\0';
      bVar32 = true;
    }
  }
  if ((flags & 1) == 0) {
    uVar9 = '\x01';
    if ((flags >> 9 & 1) != 0) goto LAB_0012128a;
  }
  else {
    uVar9 = '\0';
LAB_0012128a:
    edit->mode = uVar9;
  }
  bVar10 = edit->active;
  uVar31 = (uint)(bVar10 == 0);
  local_158 = uVar31 * 5 + 5;
  if ((int)(char)uVar1 == (uint)bVar10) {
    local_158 = uVar31 + 1;
  }
  local_138 = in;
  if (bVar10 == 0 || in == (nk_input *)0x0) {
    bVar32 = true;
  }
  else {
    iVar14 = (in->keyboard).keys[1].down;
    rect_00.y = fStack_194;
    rect_00.x = local_198;
    local_178 = (nk_style_edit *)
                CONCAT44(local_178._4_4_,((in->mouse).pos.x - local_198) + (edit->scrollbar).x);
    fVar36 = ((in->mouse).pos.y - local_a8) + (edit->scrollbar).y;
    rect_00.h = fStack_e4;
    rect_00.w = local_e8;
    iVar12 = nk_input_is_mouse_hovering_rect(in,rect_00);
    if (bVar32) {
      if (iVar12 == 0) {
LAB_00121461:
        bVar32 = false;
      }
      else {
        if ((in->mouse).buttons[0].down == 0) {
LAB_0012141a:
          if (((in->mouse).buttons[2].clicked == 0) || ((in->mouse).buttons[2].down == 0))
          goto LAB_00121461;
          nk_textedit_key(edit,NK_KEY_TEXT_WORD_LEFT,0,font,fVar38);
          nk_textedit_key(edit,NK_KEY_TEXT_WORD_RIGHT,1,font,fVar38);
        }
        else {
          if ((in->mouse).buttons[0].clicked != 0) {
            iVar13 = nk_textedit_locate_coord(edit,(float)local_178,fVar36,font,fVar38);
            edit->cursor = iVar13;
            edit->select_start = iVar13;
            edit->select_end = iVar13;
            edit->has_preferred_x = '\0';
            goto LAB_0012139f;
          }
          fVar33 = (in->mouse).delta.x;
          if (((fVar33 == 0.0) && (!NAN(fVar33))) &&
             ((fVar33 = (in->mouse).delta.y, fVar33 == 0.0 && (!NAN(fVar33))))) goto LAB_0012141a;
          iVar13 = nk_textedit_locate_coord(edit,(float)local_178,fVar36,font,fVar38);
          if (edit->select_start == edit->select_end) {
            edit->select_start = edit->cursor;
          }
          edit->select_end = iVar13;
          edit->cursor = iVar13;
        }
        bVar32 = true;
      }
    }
    else {
      nk_textedit_select_all(edit);
LAB_0012139f:
      bVar32 = false;
    }
    uVar1 = edit->mode;
    for (key = NK_KEY_NONE; key != NK_KEY_MAX; key = key + NK_KEY_SHIFT) {
      if (((key & NK_KEY_MAX) != NK_KEY_ENTER) &&
         (iVar13 = nk_input_is_key_pressed(in,key), iVar13 != 0)) {
        nk_textedit_key(edit,key,iVar14,font,fVar38);
        bVar32 = true;
      }
    }
    if (uVar1 == edit->mode) {
      iVar13 = (in->keyboard).text_len;
      edit->filter = local_168;
      if (iVar13 != 0) {
        nk_textedit_text(edit,(in->keyboard).text,iVar13);
        (in->keyboard).text_len = 0;
        bVar32 = true;
      }
    }
    else {
      (in->keyboard).text_len = 0;
      edit->filter = local_168;
    }
    iVar13 = nk_input_is_key_pressed(in,NK_KEY_ENTER);
    if (iVar13 != 0) {
      if (iVar14 == 0 || -1 < (char)flags) {
        if ((flags & 4) == 0) {
          nk_textedit_text(edit,"\n",1);
        }
        else {
          local_158 = local_158 + 0x10;
        }
        bVar32 = true;
      }
      else {
        nk_textedit_text(edit,"\n",1);
        bVar32 = true;
      }
    }
    iVar14 = nk_input_is_key_pressed(in,NK_KEY_COPY);
    iVar13 = nk_input_is_key_pressed(in,NK_KEY_CUT);
    if (((flags & 0x40) != 0) && (iVar14 != 0 || iVar13 != 0)) {
      local_168 = (nk_plugin_filter)CONCAT44(local_168._4_4_,iVar12);
      iVar12 = edit->select_start;
      iVar14 = edit->select_end;
      iVar30 = iVar14;
      if (iVar12 < iVar14) {
        iVar30 = iVar12;
      }
      pcVar16 = nk_str_at_const(&edit->string,iVar30,&unicode,&glyph_len);
      p_Var4 = (edit->clip).copy;
      if (p_Var4 != (nk_plugin_copy)0x0) {
        if (iVar14 < iVar12) {
          iVar14 = iVar12;
        }
        (*p_Var4)((edit->clip).userdata,pcVar16,iVar14 - iVar30);
      }
      iVar12 = (int)(float)local_168;
      if (iVar13 != 0 && (flags & 1) == 0) {
        nk_textedit_cut(edit);
        bVar32 = true;
      }
    }
    i = local_138;
    iVar14 = nk_input_is_key_pressed(local_138,NK_KEY_PASTE);
    if ((((flags & 0x40) != 0) && (iVar14 != 0)) &&
       (p_Var5 = (edit->clip).paste, p_Var5 != (nk_plugin_paste)0x0)) {
      (*p_Var5)((edit->clip).userdata,edit);
      bVar32 = true;
    }
    iVar14 = nk_input_is_key_pressed(i,NK_KEY_TAB);
    if (((flags & 8) != 0) && (iVar14 != 0)) {
      nk_textedit_text(edit,"    ",4);
      bVar32 = true;
    }
    bVar32 = !bVar32;
    bVar10 = edit->active;
    fVar36 = (float)local_148._0_4_;
    fVar33 = (float)local_148._4_4_;
  }
  auVar7 = local_118._0_16_;
  if (bVar10 == 0) {
    uVar31 = *local_128 & 2 | 4;
  }
  else {
    uVar31 = 0x22;
  }
  uVar15 = uVar31 | 0x12;
  if (iVar12 == 0) {
    uVar15 = uVar31;
  }
  *local_128 = uVar15;
  if ((edit->string).len == 0) {
    local_1b0 = (char *)0x0;
    local_180 = 0;
  }
  else {
    local_180 = (edit->string).buffer.allocated;
    if (local_180 == 0) {
      local_1b0 = (char *)0x0;
    }
    else {
      local_1b0 = (char *)(edit->string).buffer.memory.ptr;
    }
  }
  local_d0 = (nk_style_edit *)&style->active;
  local_d8 = (nk_style_edit *)&style->hover;
  pnVar20 = local_d8;
  if ((uVar15 & 0x10) == 0) {
    pnVar20 = style;
  }
  uVar19 = (ulong)((uVar15 & 0x10) * 2);
  if ((uVar15 & 0x20) != 0) {
    pnVar20 = local_d0;
    uVar19 = 0x40;
  }
  local_118._0_16_ = auVar7;
  if (*(int *)((long)&(style->normal).type + uVar19) == 0) {
    rect_01.y = fVar33;
    rect_01.x = fVar36;
    rect_01.w = (float)local_118._0_4_;
    rect_01.h = (float)local_118._4_4_;
    nk_stroke_rect(out,rect_01,style->rounding,style->border,style->border_color);
    auVar8 = local_118._0_16_;
    auVar7 = local_148;
    rect_02.w = (float)local_118._0_4_;
    rect_02.h = (float)local_118._4_4_;
    rect_02.x = (float)local_148._0_4_;
    rect_02.y = (float)local_148._4_4_;
    local_148 = auVar7;
    local_118._0_16_ = auVar8;
    nk_fill_rect(out,rect_02,style->rounding,(pnVar20->normal).data.color);
  }
  else {
    r_00.y = fVar33;
    r_00.x = fVar36;
    r_00.w = (float)local_118._0_4_;
    r_00.h = (float)local_118._4_4_;
    nk_draw_image(out,r_00,&(pnVar20->normal).data.image,(nk_color)0xffffffff);
  }
  iVar12 = (int)font;
  if (edit->active == '\0') {
    nVar26.r = '\0';
    nVar26.g = '\0';
    nVar26.b = '\0';
    nVar26.a = '\0';
    if (((edit->string).len == 0) || (nVar23 = (edit->string).buffer.allocated, nVar23 == 0)) {
      nVar23 = 0;
      pnVar20 = (nk_style_edit *)0x0;
    }
    else {
      pnVar20 = (nk_style_edit *)(edit->string).buffer.memory.ptr;
    }
    nk_push_scissor(out,clip);
    uVar11 = *local_128 & 0x10;
    uVar31 = uVar11 >> 4;
    pnVar28 = local_d8;
    if (uVar11 == 0) {
      pnVar28 = style;
    }
    pnVar24 = local_d0;
    lVar18 = 0x2e8;
    uVar19 = 0x40;
    if ((*local_128 & 0x20) == 0) {
      pnVar24 = pnVar28;
      lVar18 = (ulong)uVar31 * 4 + 0x2e0;
      uVar19 = (ulong)(uVar31 << 5);
    }
    if (*(int *)((long)&(style->normal).type + uVar19) != 1) {
      nVar26 = (pnVar24->normal).data.color;
    }
    nk_edit_draw_text(out,pnVar20,local_198 - (edit->scrollbar).x,local_a8 - (edit->scrollbar).y,0.0
                      ,(char *)(nVar23 & 0xffffffff),iVar12,fVar38,
                      (nk_user_font *)(ulong)(uint)nVar26,
                      *(nk_color *)((long)&(style->normal).type + lVar18),(nk_color)0x0,
                      in_stack_fffffffffffffe00);
    goto LAB_001223bf;
  }
  local_ec = local_e8 - style->cursor_size;
  iVar14 = edit->select_start;
  local_154 = edit->select_end;
  local_150 = local_154;
  if (iVar14 < local_154) {
    local_150 = iVar14;
  }
  if (local_154 < iVar14) {
    local_154 = iVar14;
  }
  if ((int)local_180 != 0 && local_1b0 != (char *)0x0) {
    unicode_1 = 0;
    iVar14 = nk_utf_decode(local_1b0,&unicode_1,(int)local_180);
    fVar36 = (*font->width)(font->userdata,font->height,local_1b0,iVar14);
    local_130 = 1;
    local_88 = 0;
    iVar13 = 0;
    local_78 = 0;
    local_168 = (nk_plugin_filter)0x0;
    uStack_160 = 0;
    local_1e0 = (nk_style_edit *)0x0;
    pnVar20 = (nk_style_edit *)0x0;
    local_1a8 = (char *)0x0;
    local_b8 = 0;
    uStack_b0 = 0;
    uVar19 = 0;
    do {
      fVar33 = (float)((int)local_130 + -1) * fVar38;
      local_100 = local_1b0 + (int)uVar19;
      uVar34 = (ulong)(uint)fVar36;
      local_178 = (nk_style_edit *)0x0;
      uStack_170 = 0;
      nVar23 = local_180;
      local_f8 = uVar19;
      while( true ) {
        iVar30 = (int)uVar19;
        if (((int)nVar23 <= iVar30) || (iVar14 == 0)) {
          fVar36 = (float)(int)local_130 * fVar38;
          if ((local_1a8 == (char *)0x0) && (edit->cursor == (edit->string).len)) {
            local_168._4_4_ = fVar36 - fVar38;
            local_168._0_4_ = (float)local_178;
            uStack_160._0_4_ = (float)local_178._4_4_;
            uStack_160._4_4_ = (float)(int)(uVar34 >> 0x20);
          }
          goto LAB_00121dc6;
        }
        if (local_1a8 == (char *)0x0) {
          if (iVar13 == edit->cursor) {
            nVar6 = nk_text_calculate_text_bounds
                              (font,local_100,iVar30 - (int)local_f8,fVar38,(char **)&unicode,
                               (nk_vec2 *)&glyph_len,&glyph_offset,in_stack_fffffffffffffdf8);
            local_168._0_4_ = nVar6.x;
            local_1a8 = local_1b0 + iVar30;
            nVar23 = local_180;
            local_168._4_4_ = fVar33;
            uStack_160._0_4_ = (float)extraout_XMM0_Dc;
            uStack_160._4_4_ = (float)extraout_XMM0_Dd;
          }
          else {
            local_1a8 = (char *)0x0;
          }
        }
        if (pnVar20 == (nk_style_edit *)0x0) {
          if (edit->select_start == edit->select_end) {
            pnVar20 = (nk_style_edit *)0x0;
          }
          else {
            pnVar20 = (nk_style_edit *)0x0;
            if (local_150 == iVar13) {
              nVar6 = nk_text_calculate_text_bounds
                                (font,local_100,iVar30 - (int)local_f8,fVar38,(char **)&unicode,
                                 (nk_vec2 *)&glyph_len,&glyph_offset,in_stack_fffffffffffffdf8);
              local_78 = CONCAT44(fVar33,nVar6.x);
              pnVar20 = (nk_style_edit *)(local_1b0 + iVar30);
              nVar23 = local_180;
            }
          }
        }
        if (local_1e0 == (nk_style_edit *)0x0) {
          if (edit->select_start == edit->select_end) {
            local_1e0 = (nk_style_edit *)0x0;
          }
          else {
            local_1e0 = (nk_style_edit *)0x0;
            if (local_154 == iVar13) {
              nVar6 = nk_text_calculate_text_bounds
                                (font,local_100,iVar30 - (int)local_f8,fVar38,(char **)&unicode,
                                 (nk_vec2 *)&glyph_len,&glyph_offset,in_stack_fffffffffffffdf8);
              local_88 = CONCAT44(fVar33,nVar6.x);
              local_1e0 = (nk_style_edit *)(local_1b0 + iVar30);
              nVar23 = local_180;
            }
          }
        }
        if (unicode_1 == 10) break;
        iVar13 = iVar13 + 1;
        uVar31 = iVar30 + iVar14;
        uVar19 = (ulong)uVar31;
        local_178 = (nk_style_edit *)CONCAT44(local_178._4_4_,(float)local_178 + (float)uVar34);
        iVar14 = nk_utf_decode(local_1b0 + (int)uVar31,&unicode_1,(int)nVar23 - uVar31);
        fVar36 = (*font->width)(font->userdata,font->height,local_1b0 + (int)uVar31,iVar14);
        uVar34 = CONCAT44(extraout_XMM0_Db,fVar36);
      }
      fVar36 = (float)local_178;
      if ((float)local_178 <= (float)local_b8) {
        fVar36 = (float)local_b8;
      }
      local_b8 = CONCAT44(local_b8._4_4_,fVar36);
      local_130 = (ulong)((int)local_130 + 1);
      iVar13 = iVar13 + 1;
      iVar14 = nk_utf_decode(local_1b0 + (long)iVar30 + 1,&unicode_1,(int)nVar23 - (iVar30 + 1U));
      fVar36 = (*font->width)(font->userdata,font->height,local_1b0 + (long)iVar30 + 1,iVar14);
      uVar19 = (ulong)(iVar30 + 1U);
    } while( true );
  }
  local_88 = 0;
  local_78 = 0;
  local_168._0_4_ = 0.0;
  local_168._4_4_ = 0.0;
  uStack_160._0_4_ = 0.0;
  local_1e0 = (nk_style_edit *)0x0;
  pnVar20 = (nk_style_edit *)0x0;
  local_1a8 = (char *)0x0;
  fVar36 = 0.0;
  uStack_160._4_4_ = (float)0;
LAB_00121dc6:
  local_178 = pnVar20;
  if (bVar32) {
    if (uVar11 != 0) {
      fVar33 = (edit->scrollbar).y;
LAB_00121ed2:
      fVar35 = (style->scrollbar_size).x;
      scroll.y = fStack_194;
      scroll.x = (((float)local_148._0_4_ + (float)local_118._0_4_) - style->border) - fVar35;
      scroll.h = fStack_e4;
      scroll.w = fVar35;
      fVar37 = nk_do_scrollbarv((nk_flags *)&glyph_len,out,scroll,0,fVar33,fVar36,fVar37 * 0.1,
                                fVar37 * 0.01,&style->scrollbar,local_138,font);
      (edit->scrollbar).y = fVar37;
    }
  }
  else {
    if ((flags >> 8 & 1) == 0) {
      fVar33 = local_ec;
      if (local_ec <= 0.0) {
        fVar33 = 0.0;
      }
      fVar35 = (edit->scrollbar).x;
      if ((float)local_168 < fVar35) {
        fVar35 = (float)local_168 - fVar33 * 0.25;
        if (fVar35 <= 0.0) {
          fVar35 = 0.0;
        }
        fVar35 = (float)(int)fVar35;
        (edit->scrollbar).x = fVar35;
      }
      if (fVar33 + fVar35 <= (float)local_168) {
        fVar35 = fVar33 * 0.25 + fVar35;
        (edit->scrollbar).x = (float)(-(uint)(0.0 < fVar35) & (uint)(float)(int)fVar35);
      }
    }
    else {
      (edit->scrollbar).x = 0.0;
    }
    if (uVar11 != 0) {
      fVar33 = (edit->scrollbar).y;
      if (local_168._4_4_ < fVar33) {
        fVar33 = local_168._4_4_ - fVar38;
        if (fVar33 <= 0.0) {
          fVar33 = 0.0;
        }
        (edit->scrollbar).y = fVar33;
      }
      if (fVar37 + fVar33 <= local_168._4_4_) {
        fVar33 = fVar33 + fVar38;
        (edit->scrollbar).y = fVar33;
      }
      goto LAB_00121ed2;
    }
    (edit->scrollbar).y = 0.0;
  }
  nk_push_scissor(out,clip);
  if ((*local_128 & 0x20) == 0) {
    if ((*local_128 & 0x10) == 0) {
      pnVar25 = &style->text_normal;
      pnVar17 = &style->selected_text_normal;
      pnVar21 = &style->selected_normal;
      pnVar29 = &style->cursor_normal;
      pnVar27 = &style->cursor_text_normal;
      pnVar20 = style;
    }
    else {
      pnVar25 = &style->text_hover;
      pnVar17 = &style->selected_text_hover;
      pnVar21 = &style->selected_hover;
      pnVar27 = &style->cursor_text_hover;
      pnVar29 = &style->cursor_hover;
      pnVar20 = local_d8;
    }
  }
  else {
    pnVar25 = &style->text_active;
    pnVar17 = &style->selected_text_hover;
    pnVar21 = &style->selected_hover;
    pnVar29 = &style->cursor_hover;
    pnVar27 = &style->cursor_text_hover;
    pnVar20 = local_d0;
  }
  uVar11 = 0;
  if ((pnVar20->normal).type != NK_STYLE_ITEM_IMAGE) {
    uVar11 = *(uint *)&(pnVar20->normal).data;
  }
  nVar26 = *pnVar29;
  background = *pnVar25;
  nVar2 = *pnVar27;
  iVar14 = edit->select_start;
  iVar13 = edit->select_end;
  if (iVar14 == iVar13) {
    if ((edit->string).len == 0) {
      local_1e0 = (nk_style_edit *)0x0;
      pcVar16 = (char *)0x0;
    }
    else {
      pcVar16 = (char *)(edit->string).buffer.allocated;
      if (pcVar16 == (char *)0x0) {
        local_1e0 = (nk_style_edit *)0x0;
      }
      else {
        local_1e0 = (nk_style_edit *)(edit->string).buffer.memory.ptr;
      }
    }
    fVar37 = local_198 - (edit->scrollbar).x;
    fVar36 = local_a8 - (edit->scrollbar).y;
    nVar39.r = '\0';
    nVar39.g = '\0';
    nVar39.b = '\0';
    nVar39.a = '\0';
    local_88._0_4_ = 0.0;
LAB_001220d8:
    nk_edit_draw_text(out,local_1e0,fVar37,fVar36,(float)local_88,pcVar16,iVar12,fVar38,
                      (nk_user_font *)(ulong)uVar11,background,nVar39,in_stack_fffffffffffffe00);
  }
  else {
    nVar39 = *pnVar17;
    nVar3 = *pnVar21;
    if (0 < local_150) {
      if ((edit->string).len == 0) {
        pnVar20 = (nk_style_edit *)0x0;
      }
      else if ((edit->string).buffer.allocated == 0) {
        pnVar20 = (nk_style_edit *)0x0;
      }
      else {
        pnVar20 = (nk_style_edit *)(edit->string).buffer.memory.ptr;
      }
      if (local_178 == (nk_style_edit *)0x0) {
        __assert_fail("select_begin_ptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                      ,0x5ae5,
                      "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                     );
      }
      nk_edit_draw_text(out,pnVar20,local_198 - (edit->scrollbar).x,local_a8 - (edit->scrollbar).y,
                        0.0,(char *)(ulong)(uint)((int)local_178 - (int)pnVar20),iVar12,fVar38,
                        (nk_user_font *)(ulong)uVar11,background,(nk_color)0x0,
                        in_stack_fffffffffffffe00);
      iVar14 = edit->select_start;
      iVar13 = edit->select_end;
    }
    if (iVar14 != iVar13) {
      if (local_178 == (nk_style_edit *)0x0) {
        __assert_fail("select_begin_ptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                      ,0x5aec,
                      "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                     );
      }
      if (local_1e0 == (nk_style_edit *)0x0) {
        if ((edit->string).len == 0) {
          pvVar22 = (void *)0x0;
          lVar18 = 0;
        }
        else {
          nVar23 = (edit->string).buffer.allocated;
          if (nVar23 == 0) {
            pvVar22 = (void *)0x0;
          }
          else {
            pvVar22 = (edit->string).buffer.memory.ptr;
          }
          lVar18 = (long)(int)nVar23;
        }
        local_1e0 = (nk_style_edit *)((long)pvVar22 + lVar18);
      }
      nk_edit_draw_text(out,local_178,local_198 - (edit->scrollbar).x,
                        (fStack_194 + local_78._4_4_) - (edit->scrollbar).y,(float)local_78,
                        (char *)(ulong)(uint)((int)local_1e0 - (int)local_178),iVar12,fVar38,
                        (nk_user_font *)(ulong)(uint)nVar3,nVar39,(nk_color)0x1,
                        in_stack_fffffffffffffe00);
      if ((edit->select_start != edit->select_end) &&
         (iVar14 = (edit->string).len, local_154 < iVar14)) {
        if (iVar14 == 0) {
          iVar14 = 0;
          iVar13 = 0;
        }
        else {
          nVar23 = (edit->string).buffer.allocated;
          if (nVar23 == 0) {
            iVar14 = 0;
          }
          else {
            iVar14 = (int)(edit->string).buffer.memory.ptr;
          }
          iVar13 = (int)nVar23;
        }
        if (local_1e0 == (nk_style_edit *)0x0) {
          __assert_fail("select_end_ptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                        ,0x5aff,
                        "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                       );
        }
        fVar37 = local_198 - (edit->scrollbar).x;
        fVar36 = (fStack_194 + local_88._4_4_) - (edit->scrollbar).y;
        pcVar16 = (char *)(ulong)(uint)((iVar14 + iVar13) - (int)local_1e0);
        nVar39.r = '\x01';
        nVar39.g = '\0';
        nVar39.b = '\0';
        nVar39.a = '\0';
        goto LAB_001220d8;
      }
    }
  }
  if (edit->select_start == edit->select_end) {
    iVar12 = (edit->string).len;
    if (iVar12 == 0) {
      iVar12 = 0;
    }
    else if ((edit->string).buffer.allocated == 0) {
      iVar12 = 0;
    }
    if (edit->cursor < iVar12) {
      if (local_1a8 == (char *)0x0) {
        __assert_fail("cursor_ptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                      ,0x5b1d,
                      "nk_flags nk_do_edit(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_flags, nk_plugin_filter, struct nk_text_edit *, const struct nk_style_edit *, struct nk_input *, const struct nk_user_font *)"
                     );
      }
      if (*local_1a8 != '\n') {
        iVar12 = nk_utf_decode(local_1a8,&unicode,4);
        local_198 = (local_198 + (float)local_168) - (edit->scrollbar).x;
        fStack_194 = (fStack_194 + local_168._4_4_) - (edit->scrollbar).y;
        fStack_190 = (fStack_190 + (float)uStack_160) - 0.0;
        fStack_18c = (fStack_18c + uStack_160._4_4_) - 0.0;
        fVar37 = (*font->width)(font->userdata,font->height,local_1a8,iVar12);
        glyph_len = 0;
        fStack_c4 = 0.0;
        rect_04.y = fStack_194;
        rect_04.x = local_198;
        rect_04.h = fVar38;
        rect_04.w = fVar37;
        local_c0 = nVar26;
        local_bc = nVar2;
        nk_fill_rect(out,rect_04,0.0,nVar26);
        b.y = fStack_194;
        b.x = local_198;
        b.w = fVar37;
        b.h = fVar38;
        nk_widget_text(out,b,local_1a8,iVar12,(nk_text *)&glyph_len,0x11,font);
        goto LAB_001223bf;
      }
    }
    rect_03.x = (local_198 + (float)local_168) - (edit->scrollbar).x;
    rect_03.y = ((fVar38 * 0.5 + fStack_194 + local_168._4_4_) - font->height * 0.5) -
                (edit->scrollbar).y;
    rect_03.h = font->height;
    rect_03.w = style->cursor_size;
    nk_fill_rect(out,rect_03,0.0,nVar26);
  }
LAB_001223bf:
  r.w = old_clip.w;
  r.h = old_clip.h;
  r.x = old_clip.x;
  r.y = old_clip.y;
  nk_push_scissor(out,r);
  return local_158;
}

Assistant:

NK_LIB nk_flags
nk_do_edit(nk_flags *state, struct nk_command_buffer *out,
    struct nk_rect bounds, nk_flags flags, nk_plugin_filter filter,
    struct nk_text_edit *edit, const struct nk_style_edit *style,
    struct nk_input *in, const struct nk_user_font *font)
{
    struct nk_rect area;
    nk_flags ret = 0;
    float row_height;
    char prev_state = 0;
    char is_hovered = 0;
    char select_all = 0;
    char cursor_follow = 0;
    struct nk_rect old_clip;
    struct nk_rect clip;

    NK_ASSERT(state);
    NK_ASSERT(out);
    NK_ASSERT(style);
    if (!state || !out || !style)
        return ret;

    /* visible text area calculation */
    area.x = bounds.x + style->padding.x + style->border;
    area.y = bounds.y + style->padding.y + style->border;
    area.w = bounds.w - (2.0f * style->padding.x + 2 * style->border);
    area.h = bounds.h - (2.0f * style->padding.y + 2 * style->border);
    if (flags & NK_EDIT_MULTILINE)
        area.w = NK_MAX(0, area.w - style->scrollbar_size.x);
    row_height = (flags & NK_EDIT_MULTILINE)? font->height + style->row_padding: area.h;

    /* calculate clipping rectangle */
    old_clip = out->clip;
    nk_unify(&clip, &old_clip, area.x, area.y, area.x + area.w, area.y + area.h);

    /* update edit state */
    prev_state = (char)edit->active;
    is_hovered = (char)nk_input_is_mouse_hovering_rect(in, bounds);
    if (in && in->mouse.buttons[NK_BUTTON_LEFT].clicked && in->mouse.buttons[NK_BUTTON_LEFT].down) {
        edit->active = NK_INBOX(in->mouse.pos.x, in->mouse.pos.y,
                                bounds.x, bounds.y, bounds.w, bounds.h);
    }

    /* (de)activate text editor */
    if (!prev_state && edit->active) {
        const enum nk_text_edit_type type = (flags & NK_EDIT_MULTILINE) ?
            NK_TEXT_EDIT_MULTI_LINE: NK_TEXT_EDIT_SINGLE_LINE;
        nk_textedit_clear_state(edit, type, filter);
        if (flags & NK_EDIT_AUTO_SELECT)
            select_all = nk_true;
        if (flags & NK_EDIT_GOTO_END_ON_ACTIVATE) {
            edit->cursor = edit->string.len;
            in = 0;
        }
    } else if (!edit->active) edit->mode = NK_TEXT_EDIT_MODE_VIEW;
    if (flags & NK_EDIT_READ_ONLY)
        edit->mode = NK_TEXT_EDIT_MODE_VIEW;
    else if (flags & NK_EDIT_ALWAYS_INSERT_MODE)
        edit->mode = NK_TEXT_EDIT_MODE_INSERT;

    ret = (edit->active) ? NK_EDIT_ACTIVE: NK_EDIT_INACTIVE;
    if (prev_state != edit->active)
        ret |= (edit->active) ? NK_EDIT_ACTIVATED: NK_EDIT_DEACTIVATED;

    /* handle user input */
    if (edit->active && in)
    {
        int shift_mod = in->keyboard.keys[NK_KEY_SHIFT].down;
        const float mouse_x = (in->mouse.pos.x - area.x) + edit->scrollbar.x;
        const float mouse_y = (in->mouse.pos.y - area.y) + edit->scrollbar.y;

        /* mouse click handler */
        is_hovered = (char)nk_input_is_mouse_hovering_rect(in, area);
        if (select_all) {
            nk_textedit_select_all(edit);
        } else if (is_hovered && in->mouse.buttons[NK_BUTTON_LEFT].down &&
            in->mouse.buttons[NK_BUTTON_LEFT].clicked) {
            nk_textedit_click(edit, mouse_x, mouse_y, font, row_height);
        } else if (is_hovered && in->mouse.buttons[NK_BUTTON_LEFT].down &&
            (in->mouse.delta.x != 0.0f || in->mouse.delta.y != 0.0f)) {
            nk_textedit_drag(edit, mouse_x, mouse_y, font, row_height);
            cursor_follow = nk_true;
        } else if (is_hovered && in->mouse.buttons[NK_BUTTON_RIGHT].clicked &&
            in->mouse.buttons[NK_BUTTON_RIGHT].down) {
            nk_textedit_key(edit, NK_KEY_TEXT_WORD_LEFT, nk_false, font, row_height);
            nk_textedit_key(edit, NK_KEY_TEXT_WORD_RIGHT, nk_true, font, row_height);
            cursor_follow = nk_true;
        }

        {int i; /* keyboard input */
        int old_mode = edit->mode;
        for (i = 0; i < NK_KEY_MAX; ++i) {
            if (i == NK_KEY_ENTER || i == NK_KEY_TAB) continue; /* special case */
            if (nk_input_is_key_pressed(in, (enum nk_keys)i)) {
                nk_textedit_key(edit, (enum nk_keys)i, shift_mod, font, row_height);
                cursor_follow = nk_true;
            }
        }
        if (old_mode != edit->mode) {
            in->keyboard.text_len = 0;
        }}

        /* text input */
        edit->filter = filter;
        if (in->keyboard.text_len) {
            nk_textedit_text(edit, in->keyboard.text, in->keyboard.text_len);
            cursor_follow = nk_true;
            in->keyboard.text_len = 0;
        }

        /* enter key handler */
        if (nk_input_is_key_pressed(in, NK_KEY_ENTER)) {
            cursor_follow = nk_true;
            if (flags & NK_EDIT_CTRL_ENTER_NEWLINE && shift_mod)
                nk_textedit_text(edit, "\n", 1);
            else if (flags & NK_EDIT_SIG_ENTER)
                ret |= NK_EDIT_COMMITED;
            else nk_textedit_text(edit, "\n", 1);
        }

        /* cut & copy handler */
        {int copy= nk_input_is_key_pressed(in, NK_KEY_COPY);
        int cut = nk_input_is_key_pressed(in, NK_KEY_CUT);
        if ((copy || cut) && (flags & NK_EDIT_CLIPBOARD))
        {
            int glyph_len;
            nk_rune unicode;
            const char *text;
            int b = edit->select_start;
            int e = edit->select_end;

            int begin = NK_MIN(b, e);
            int end = NK_MAX(b, e);
            text = nk_str_at_const(&edit->string, begin, &unicode, &glyph_len);
            if (edit->clip.copy)
                edit->clip.copy(edit->clip.userdata, text, end - begin);
            if (cut && !(flags & NK_EDIT_READ_ONLY)){
                nk_textedit_cut(edit);
                cursor_follow = nk_true;
            }
        }}

        /* paste handler */
        {int paste = nk_input_is_key_pressed(in, NK_KEY_PASTE);
        if (paste && (flags & NK_EDIT_CLIPBOARD) && edit->clip.paste) {
            edit->clip.paste(edit->clip.userdata, edit);
            cursor_follow = nk_true;
        }}

        /* tab handler */
        {int tab = nk_input_is_key_pressed(in, NK_KEY_TAB);
        if (tab && (flags & NK_EDIT_ALLOW_TAB)) {
            nk_textedit_text(edit, "    ", 4);
            cursor_follow = nk_true;
        }}
    }

    /* set widget state */
    if (edit->active)
        *state = NK_WIDGET_STATE_ACTIVE;
    else nk_widget_state_reset(state);

    if (is_hovered)
        *state |= NK_WIDGET_STATE_HOVERED;

    /* DRAW EDIT */
    {const char *text = nk_str_get_const(&edit->string);
    int len = nk_str_len_char(&edit->string);

    {/* select background colors/images  */
    const struct nk_style_item *background;
    if (*state & NK_WIDGET_STATE_ACTIVED)
        background = &style->active;
    else if (*state & NK_WIDGET_STATE_HOVER)
        background = &style->hover;
    else background = &style->normal;

    /* draw background frame */
    if (background->type == NK_STYLE_ITEM_COLOR) {
        nk_stroke_rect(out, bounds, style->rounding, style->border, style->border_color);
        nk_fill_rect(out, bounds, style->rounding, background->data.color);
    } else nk_draw_image(out, bounds, &background->data.image, nk_white);}

    area.w = NK_MAX(0, area.w - style->cursor_size);
    if (edit->active)
    {
        int total_lines = 1;
        struct nk_vec2 text_size = nk_vec2(0,0);

        /* text pointer positions */
        const char *cursor_ptr = 0;
        const char *select_begin_ptr = 0;
        const char *select_end_ptr = 0;

        /* 2D pixel positions */
        struct nk_vec2 cursor_pos = nk_vec2(0,0);
        struct nk_vec2 selection_offset_start = nk_vec2(0,0);
        struct nk_vec2 selection_offset_end = nk_vec2(0,0);

        int selection_begin = NK_MIN(edit->select_start, edit->select_end);
        int selection_end = NK_MAX(edit->select_start, edit->select_end);

        /* calculate total line count + total space + cursor/selection position */
        float line_width = 0.0f;
        if (text && len)
        {
            /* utf8 encoding */
            float glyph_width;
            int glyph_len = 0;
            nk_rune unicode = 0;
            int text_len = 0;
            int glyphs = 0;
            int row_begin = 0;

            glyph_len = nk_utf_decode(text, &unicode, len);
            glyph_width = font->width(font->userdata, font->height, text, glyph_len);
            line_width = 0;

            /* iterate all lines */
            while ((text_len < len) && glyph_len)
            {
                /* set cursor 2D position and line */
                if (!cursor_ptr && glyphs == edit->cursor)
                {
                    int glyph_offset;
                    struct nk_vec2 out_offset;
                    struct nk_vec2 row_size;
                    const char *remaining;

                    /* calculate 2d position */
                    cursor_pos.y = (float)(total_lines-1) * row_height;
                    row_size = nk_text_calculate_text_bounds(font, text+row_begin,
                                text_len-row_begin, row_height, &remaining,
                                &out_offset, &glyph_offset, NK_STOP_ON_NEW_LINE);
                    cursor_pos.x = row_size.x;
                    cursor_ptr = text + text_len;
                }

                /* set start selection 2D position and line */
                if (!select_begin_ptr && edit->select_start != edit->select_end &&
                    glyphs == selection_begin)
                {
                    int glyph_offset;
                    struct nk_vec2 out_offset;
                    struct nk_vec2 row_size;
                    const char *remaining;

                    /* calculate 2d position */
                    selection_offset_start.y = (float)(NK_MAX(total_lines-1,0)) * row_height;
                    row_size = nk_text_calculate_text_bounds(font, text+row_begin,
                                text_len-row_begin, row_height, &remaining,
                                &out_offset, &glyph_offset, NK_STOP_ON_NEW_LINE);
                    selection_offset_start.x = row_size.x;
                    select_begin_ptr = text + text_len;
                }

                /* set end selection 2D position and line */
                if (!select_end_ptr && edit->select_start != edit->select_end &&
                    glyphs == selection_end)
                {
                    int glyph_offset;
                    struct nk_vec2 out_offset;
                    struct nk_vec2 row_size;
                    const char *remaining;

                    /* calculate 2d position */
                    selection_offset_end.y = (float)(total_lines-1) * row_height;
                    row_size = nk_text_calculate_text_bounds(font, text+row_begin,
                                text_len-row_begin, row_height, &remaining,
                                &out_offset, &glyph_offset, NK_STOP_ON_NEW_LINE);
                    selection_offset_end.x = row_size.x;
                    select_end_ptr = text + text_len;
                }
                if (unicode == '\n') {
                    text_size.x = NK_MAX(text_size.x, line_width);
                    total_lines++;
                    line_width = 0;
                    text_len++;
                    glyphs++;
                    row_begin = text_len;
                    glyph_len = nk_utf_decode(text + text_len, &unicode, len-text_len);
                    glyph_width = font->width(font->userdata, font->height, text+text_len, glyph_len);
                    continue;
                }

                glyphs++;
                text_len += glyph_len;
                line_width += (float)glyph_width;

                glyph_len = nk_utf_decode(text + text_len, &unicode, len-text_len);
                glyph_width = font->width(font->userdata, font->height,
                    text+text_len, glyph_len);
                continue;
            }
            text_size.y = (float)total_lines * row_height;

            /* handle case when cursor is at end of text buffer */
            if (!cursor_ptr && edit->cursor == edit->string.len) {
                cursor_pos.x = line_width;
                cursor_pos.y = text_size.y - row_height;
            }
        }
        {
            /* scrollbar */
            if (cursor_follow)
            {
                /* update scrollbar to follow cursor */
                if (!(flags & NK_EDIT_NO_HORIZONTAL_SCROLL)) {
                    /* horizontal scroll */
                    const float scroll_increment = area.w * 0.25f;
                    if (cursor_pos.x < edit->scrollbar.x)
                        edit->scrollbar.x = (float)(int)NK_MAX(0.0f, cursor_pos.x - scroll_increment);
                    if (cursor_pos.x >= edit->scrollbar.x + area.w)
                        edit->scrollbar.x = (float)(int)NK_MAX(0.0f, edit->scrollbar.x + scroll_increment);
                } else edit->scrollbar.x = 0;

                if (flags & NK_EDIT_MULTILINE) {
                    /* vertical scroll */
                    if (cursor_pos.y < edit->scrollbar.y)
                        edit->scrollbar.y = NK_MAX(0.0f, cursor_pos.y - row_height);
                    if (cursor_pos.y >= edit->scrollbar.y + area.h)
                        edit->scrollbar.y = edit->scrollbar.y + row_height;
                } else edit->scrollbar.y = 0;
            }

            /* scrollbar widget */
            if (flags & NK_EDIT_MULTILINE)
            {
                nk_flags ws;
                struct nk_rect scroll;
                float scroll_target;
                float scroll_offset;
                float scroll_step;
                float scroll_inc;

                scroll = area;
                scroll.x = (bounds.x + bounds.w - style->border) - style->scrollbar_size.x;
                scroll.w = style->scrollbar_size.x;

                scroll_offset = edit->scrollbar.y;
                scroll_step = scroll.h * 0.10f;
                scroll_inc = scroll.h * 0.01f;
                scroll_target = text_size.y;
                edit->scrollbar.y = nk_do_scrollbarv(&ws, out, scroll, 0,
                        scroll_offset, scroll_target, scroll_step, scroll_inc,
                        &style->scrollbar, in, font);
            }
        }

        /* draw text */
        {struct nk_color background_color;
        struct nk_color text_color;
        struct nk_color sel_background_color;
        struct nk_color sel_text_color;
        struct nk_color cursor_color;
        struct nk_color cursor_text_color;
        const struct nk_style_item *background;
        nk_push_scissor(out, clip);

        /* select correct colors to draw */
        if (*state & NK_WIDGET_STATE_ACTIVED) {
            background = &style->active;
            text_color = style->text_active;
            sel_text_color = style->selected_text_hover;
            sel_background_color = style->selected_hover;
            cursor_color = style->cursor_hover;
            cursor_text_color = style->cursor_text_hover;
        } else if (*state & NK_WIDGET_STATE_HOVER) {
            background = &style->hover;
            text_color = style->text_hover;
            sel_text_color = style->selected_text_hover;
            sel_background_color = style->selected_hover;
            cursor_text_color = style->cursor_text_hover;
            cursor_color = style->cursor_hover;
        } else {
            background = &style->normal;
            text_color = style->text_normal;
            sel_text_color = style->selected_text_normal;
            sel_background_color = style->selected_normal;
            cursor_color = style->cursor_normal;
            cursor_text_color = style->cursor_text_normal;
        }
        if (background->type == NK_STYLE_ITEM_IMAGE)
            background_color = nk_rgba(0,0,0,0);
        else background_color = background->data.color;


        if (edit->select_start == edit->select_end) {
            /* no selection so just draw the complete text */
            const char *begin = nk_str_get_const(&edit->string);
            int l = nk_str_len_char(&edit->string);
            nk_edit_draw_text(out, style, area.x - edit->scrollbar.x,
                area.y - edit->scrollbar.y, 0, begin, l, row_height, font,
                background_color, text_color, nk_false);
        } else {
            /* edit has selection so draw 1-3 text chunks */
            if (edit->select_start != edit->select_end && selection_begin > 0){
                /* draw unselected text before selection */
                const char *begin = nk_str_get_const(&edit->string);
                NK_ASSERT(select_begin_ptr);
                nk_edit_draw_text(out, style, area.x - edit->scrollbar.x,
                    area.y - edit->scrollbar.y, 0, begin, (int)(select_begin_ptr - begin),
                    row_height, font, background_color, text_color, nk_false);
            }
            if (edit->select_start != edit->select_end) {
                /* draw selected text */
                NK_ASSERT(select_begin_ptr);
                if (!select_end_ptr) {
                    const char *begin = nk_str_get_const(&edit->string);
                    select_end_ptr = begin + nk_str_len_char(&edit->string);
                }
                nk_edit_draw_text(out, style,
                    area.x - edit->scrollbar.x,
                    area.y + selection_offset_start.y - edit->scrollbar.y,
                    selection_offset_start.x,
                    select_begin_ptr, (int)(select_end_ptr - select_begin_ptr),
                    row_height, font, sel_background_color, sel_text_color, nk_true);
            }
            if ((edit->select_start != edit->select_end &&
                selection_end < edit->string.len))
            {
                /* draw unselected text after selected text */
                const char *begin = select_end_ptr;
                const char *end = nk_str_get_const(&edit->string) +
                                    nk_str_len_char(&edit->string);
                NK_ASSERT(select_end_ptr);
                nk_edit_draw_text(out, style,
                    area.x - edit->scrollbar.x,
                    area.y + selection_offset_end.y - edit->scrollbar.y,
                    selection_offset_end.x,
                    begin, (int)(end - begin), row_height, font,
                    background_color, text_color, nk_true);
            }
        }

        /* cursor */
        if (edit->select_start == edit->select_end)
        {
            if (edit->cursor >= nk_str_len(&edit->string) ||
                (cursor_ptr && *cursor_ptr == '\n')) {
                /* draw cursor at end of line */
                struct nk_rect cursor;
                cursor.w = style->cursor_size;
                cursor.h = font->height;
                cursor.x = area.x + cursor_pos.x - edit->scrollbar.x;
                cursor.y = area.y + cursor_pos.y + row_height/2.0f - cursor.h/2.0f;
                cursor.y -= edit->scrollbar.y;
                nk_fill_rect(out, cursor, 0, cursor_color);
            } else {
                /* draw cursor inside text */
                int glyph_len;
                struct nk_rect label;
                struct nk_text txt;

                nk_rune unicode;
                NK_ASSERT(cursor_ptr);
                glyph_len = nk_utf_decode(cursor_ptr, &unicode, 4);

                label.x = area.x + cursor_pos.x - edit->scrollbar.x;
                label.y = area.y + cursor_pos.y - edit->scrollbar.y;
                label.w = font->width(font->userdata, font->height, cursor_ptr, glyph_len);
                label.h = row_height;

                txt.padding = nk_vec2(0,0);
                txt.background = cursor_color;;
                txt.text = cursor_text_color;
                nk_fill_rect(out, label, 0, cursor_color);
                nk_widget_text(out, label, cursor_ptr, glyph_len, &txt, NK_TEXT_LEFT, font);
            }
        }}
    } else {
        /* not active so just draw text */
        int l = nk_str_len_char(&edit->string);
        const char *begin = nk_str_get_const(&edit->string);

        const struct nk_style_item *background;
        struct nk_color background_color;
        struct nk_color text_color;
        nk_push_scissor(out, clip);
        if (*state & NK_WIDGET_STATE_ACTIVED) {
            background = &style->active;
            text_color = style->text_active;
        } else if (*state & NK_WIDGET_STATE_HOVER) {
            background = &style->hover;
            text_color = style->text_hover;
        } else {
            background = &style->normal;
            text_color = style->text_normal;
        }
        if (background->type == NK_STYLE_ITEM_IMAGE)
            background_color = nk_rgba(0,0,0,0);
        else background_color = background->data.color;
        nk_edit_draw_text(out, style, area.x - edit->scrollbar.x,
            area.y - edit->scrollbar.y, 0, begin, l, row_height, font,
            background_color, text_color, nk_false);
    }
    nk_push_scissor(out, old_clip);}
    return ret;
}